

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O1

parser_error parse_player_timed_brand(parser *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  parser_error pVar4;
  long *plVar5;
  char *__s1;
  brand_conflict *pbVar6;
  ulong uVar7;
  
  plVar5 = (long *)parser_priv(p);
  __s1 = parser_getsym(p,"name");
  if (plVar5 == (long *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0x170,"enum parser_error parse_player_timed_brand(struct parser *)");
  }
  lVar2 = *plVar5;
  if (lVar2 == 0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    bVar1 = z_info->brand_max;
    uVar7 = (ulong)(uint)bVar1;
    if ((__s1 != (char *)0x0) && (uVar7 = 1, 1 < bVar1)) {
      uVar7 = 1;
      pbVar6 = brands;
      do {
        pbVar6 = pbVar6 + 1;
        iVar3 = strcmp(__s1,pbVar6->code);
        if (iVar3 == 0) goto LAB_001c0d4b;
        uVar7 = uVar7 + 1;
      } while ((uint)bVar1 != uVar7);
      uVar7 = (ulong)(uint)bVar1;
    }
LAB_001c0d4b:
    pVar4 = PARSE_ERROR_UNRECOGNISED_BRAND;
    if ((uint)uVar7 != (uint)bVar1) {
      *(uint *)(lVar2 + 0x6c) = (uint)uVar7;
      pVar4 = PARSE_ERROR_NONE;
    }
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_player_timed_brand(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getsym(p, "name");
	int idx = z_info->brand_max;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (name) {
		for (idx = 1; idx < z_info->brand_max; ++idx) {
			if (streq(name, brands[idx].code)) break;
		}
	}
	if (idx == z_info->brand_max) {
		return PARSE_ERROR_UNRECOGNISED_BRAND;
	}
	ps->t->temp_brand = idx;
	return PARSE_ERROR_NONE;
}